

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::segmentcheck(string *unit,char closeSegment,size_t *index)

{
  byte mchar;
  char closeSegment_00;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = *index;
  if (uVar2 < unit->_M_string_length) {
    do {
      mchar = (unit->_M_dataplus)._M_p[uVar2];
      *index = uVar2 + 1;
      bVar3 = mchar == closeSegment;
      if (bVar3) {
        return bVar3;
      }
      if (mchar < 0x5c) {
        if (mchar < 0x29) {
          if ((mchar == 0x22) || (mchar == 0x28)) {
            closeSegment_00 = getMatchCharacter(mchar);
LAB_00184edd:
            bVar1 = segmentcheck(unit,closeSegment_00,index);
            if (!bVar1) {
              return bVar3;
            }
          }
        }
        else {
          if (mchar == 0x5b) {
LAB_00184ed0:
            closeSegment_00 = getMatchCharacter(mchar);
            if (closeSegment_00 == closeSegment) {
              return bVar3;
            }
            goto LAB_00184edd;
          }
          if (mchar == 0x29) {
            return bVar3;
          }
        }
      }
      else if (mchar < 0x7b) {
        if (mchar == 0x5c) {
          *index = uVar2 + 2;
        }
        else if (mchar == 0x5d) {
          return bVar3;
        }
      }
      else {
        if (mchar == 0x7b) goto LAB_00184ed0;
        if (mchar == 0x7d) {
          return bVar3;
        }
      }
      uVar2 = *index;
    } while (uVar2 < unit->_M_string_length);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool
    segmentcheck(const std::string& unit, char closeSegment, size_t& index)
{
    while (index < unit.size()) {
        char current = unit[index];
        ++index;
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '\\':
                ++index;
                break;
            case '(':
            case '"':
                if (!segmentcheck(unit, getMatchCharacter(current), index)) {
                    return false;
                }
                break;
            case '{':
            case '[': {
                auto close = getMatchCharacter(current);
                if (close == closeSegment) {
                    return false;
                }
                if (!segmentcheck(unit, close, index)) {
                    return false;
                }
                break;
            }
            case '}':
            case ')':
            case ']':
                return false;
            default:
                break;
        }
    }
    return false;
}